

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5FilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *zUnused,int nVal,
                    sqlite3_value **apVal)

{
  sqlite3_vtab_cursor *__s;
  uint uVar1;
  Fts5FullTable *pTab;
  Fts5Config *pConfig;
  char **ppcVar2;
  Fts5Cursor *pFVar3;
  Fts5Expr *p;
  Fts5Storage *p_00;
  byte bVar4;
  int iVar5;
  sqlite3_vtab *psVar6;
  char *pcVar7;
  char *pcVar8;
  char **pzErr;
  long lVar9;
  Fts5Expr *pExpr;
  sqlite3_value *pVal;
  byte *pbVar10;
  sqlite3_value *pVal_00;
  byte *pbVar11;
  long lVar12;
  uchar uVar13;
  uint uVar14;
  ulong uVar15;
  sqlite3_value *psVar16;
  byte *pbVar17;
  byte *pbVar18;
  bool bVar19;
  bool bVar20;
  char *zRank;
  sqlite3_value *local_50;
  sqlite3_vtab_cursor local_40;
  sqlite3_vtab_cursor local_38;
  
  pTab = (Fts5FullTable *)pCursor->pVtab;
  pConfig = (pTab->p).pConfig;
  ppcVar2 = pConfig->pzErrmsg;
  __s = pCursor + 4;
  if (*(int *)&pCursor[4].pVtab != 0) {
    fts5FreeCursorComponents((Fts5Cursor *)pCursor);
    memset(__s,0,0x98);
  }
  pzErr = &(pTab->p).base.zErrMsg;
  pConfig->pzErrmsg = pzErr;
  bVar19 = (idxNum & 1U) != 0;
  if (bVar19) {
    bVar20 = *apVal == (sqlite3_value *)0x0;
  }
  else {
    bVar20 = true;
  }
  uVar14 = (uint)bVar19;
  if ((idxNum & 2U) == 0) {
    local_50 = (sqlite3_value *)0x0;
  }
  else {
    uVar15 = (ulong)uVar14;
    uVar14 = uVar14 + 1;
    local_50 = apVal[uVar15];
  }
  if ((idxNum & 4U) == 0) {
    psVar16 = (sqlite3_value *)0x0;
  }
  else {
    uVar15 = (ulong)uVar14;
    uVar14 = uVar14 + 1;
    psVar16 = apVal[uVar15];
  }
  if ((idxNum & 8U) == 0) {
    pVal_00 = (sqlite3_value *)0x0;
  }
  else {
    uVar15 = (ulong)uVar14;
    uVar14 = uVar14 + 1;
    pVal_00 = apVal[uVar15];
  }
  if ((idxNum & 0x10U) == 0) {
    pVal = (sqlite3_value *)0x0;
  }
  else {
    pVal = apVal[uVar14];
  }
  uVar14 = (idxNum & 0x80U) >> 7;
  *(uint *)((long)&pCursor[4].pVtab + 4) = uVar14;
  if (psVar16 != (sqlite3_value *)0x0) {
    pVal = psVar16;
    pVal_00 = psVar16;
  }
  psVar6 = (sqlite3_vtab *)fts5GetRowidLimit(pVal_00,0x7fffffffffffffff);
  pCursor[(ulong)((idxNum & 0x80U) == 0) + 5].pVtab = psVar6;
  psVar6 = (sqlite3_vtab *)fts5GetRowidLimit(pVal,-0x8000000000000000);
  pCursor[(ulong)uVar14 + 5].pVtab = psVar6;
  pFVar3 = pTab->pSortCsr;
  if (pFVar3 != (Fts5Cursor *)0x0) {
    bVar19 = pFVar3->bDesc == 0;
    pCursor[6].pVtab = (sqlite3_vtab *)(&pFVar3->iFirstRowid)[bVar19];
    psVar6 = (sqlite3_vtab *)(&pFVar3->iFirstRowid)[!bVar19];
    pCursor[5].pVtab = psVar6;
    *(undefined4 *)&pCursor[4].pVtab = 2;
    p = pFVar3->pExpr;
    pCursor[8].pVtab = (sqlite3_vtab *)p;
    iVar5 = sqlite3Fts5ExprFirst(p,(pTab->p).pIndex,(i64)psVar6,uVar14);
    *(uint *)&pCursor[10].pVtab = (uint)(p->pRoot->bEof != 0) | *(uint *)&pCursor[10].pVtab | 0x4e;
    goto LAB_001c396c;
  }
  if (bVar20) {
    if (pConfig->zContent != (char *)0x0) {
      *(uint *)&__s->pVtab = (psVar16 != (sqlite3_value *)0x0) + 5;
      p_00 = pTab->pStorage;
      uVar15 = 2;
      if (psVar16 == (sqlite3_value *)0x0) {
        uVar15 = (ulong)(*(int *)((long)&pCursor[4].pVtab + 4) != 0);
      }
      iVar5 = fts5StorageGetStmt(p_00,(int)uVar15,(sqlite3_stmt **)(pCursor + 7),pzErr);
      if (iVar5 == 0) {
        p_00->aStmt[uVar15] = (sqlite3_stmt *)0x0;
        psVar6 = pCursor[7].pVtab;
        if (*(int *)&__s->pVtab == 6) {
          sqlite3_bind_value((sqlite3_stmt *)psVar6,1,*apVal);
        }
        else {
          sqlite3_bind_int64((sqlite3_stmt *)psVar6,1,(sqlite_int64)pCursor[5].pVtab);
          sqlite3_bind_int64((sqlite3_stmt *)pCursor[7].pVtab,2,(sqlite_int64)pCursor[6].pVtab);
        }
        iVar5 = fts5NextMethod(pCursor);
      }
      goto LAB_001c396c;
    }
    pcVar8 = sqlite3_mprintf("%s: table does not support scanning",pConfig->zName);
    pzErr = pConfig->pzErrmsg;
LAB_001c3ac1:
    *pzErr = pcVar8;
LAB_001c3b2f:
    iVar5 = 1;
    goto LAB_001c396c;
  }
  pcVar7 = (char *)sqlite3ValueText(*apVal,'\x01');
  pcVar8 = "";
  if (pcVar7 != (char *)0x0) {
    pcVar8 = pcVar7;
  }
  if (local_50 == (sqlite3_value *)0x0) {
    if ((sqlite3_vtab *)pConfig->zRank == (sqlite3_vtab *)0x0) {
      pCursor[0xc].pVtab = (sqlite3_vtab *)"bm25";
      pCursor[0xd].pVtab = (sqlite3_vtab *)0x0;
    }
    else {
      pCursor[0xc].pVtab = (sqlite3_vtab *)pConfig->zRank;
      pCursor[0xd].pVtab = (sqlite3_vtab *)pConfig->zRankArgs;
    }
  }
  else {
    pcVar7 = (char *)sqlite3ValueText(local_50,'\x01');
    local_38.pVtab = (sqlite3_vtab *)0x0;
    local_40.pVtab = (sqlite3_vtab *)0x0;
    if (pcVar7 == (char *)0x0) {
      uVar1._0_2_ = local_50->flags;
      uVar1._2_1_ = local_50->enc;
      uVar1._3_1_ = local_50->eSubtype;
      if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_001c3b16;
    }
    else {
      iVar5 = sqlite3Fts5ConfigParseRank(pcVar7,(char **)&local_38,(char **)&local_40);
      if (iVar5 == 1) {
LAB_001c3b16:
        pcVar8 = sqlite3_mprintf("parse error in rank function: %s",pcVar7);
        pCursor->pVtab->zErrMsg = pcVar8;
        goto LAB_001c3b2f;
      }
      if (iVar5 != 0) goto LAB_001c396c;
    }
    pCursor[0xc].pVtab = local_38.pVtab;
    pCursor[0xd].pVtab = local_40.pVtab;
    *(byte *)&pCursor[10].pVtab = *(byte *)&pCursor[10].pVtab | 0x10;
  }
  if (*pcVar8 != '*') {
    iVar5 = sqlite3Fts5ExprNew(pConfig,idxNum >> 0x10,pcVar8,(Fts5Expr **)(pCursor + 8),pzErr);
    if (iVar5 == 0) {
      if ((idxNum & 0x20U) == 0) {
        *(undefined4 *)&pCursor[4].pVtab = 1;
        iVar5 = fts5CursorFirst((Fts5FullTable *)(pTab->p).pIndex,(Fts5Cursor *)pCursor,uVar14);
      }
      else {
        *(undefined4 *)&pCursor[4].pVtab = 4;
        iVar5 = fts5CursorFirstSorted(pTab,(Fts5Cursor *)pCursor,uVar14);
      }
    }
    goto LAB_001c396c;
  }
  pbVar18 = (byte *)(pcVar8 + 2);
  do {
    pbVar17 = pbVar18;
    bVar4 = pbVar17[-1];
    pbVar18 = pbVar17 + 1;
  } while (bVar4 == 0x20);
  pbVar11 = pbVar17 + 4;
  lVar9 = 0;
  pbVar10 = pbVar17;
  while ((bVar4 & 0xdf) != 0) {
    lVar9 = lVar9 + -1;
    bVar4 = *pbVar10;
    pbVar10 = pbVar10 + 1;
  }
  *(undefined4 *)&__s->pVtab = 3;
  if (lVar9 != 0) {
    uVar14 = (uint)lVar9;
    lVar12 = 0;
    do {
      if (lVar12 == 5) {
        uVar13 = '\0';
LAB_001c3c6c:
        if (uVar13 != ""[*pbVar11]) {
          lVar12 = 0;
          goto LAB_001c3caf;
        }
        break;
      }
      uVar13 = ""[(byte)"threads"[lVar12 + 2]];
      if (uVar13 != ""[pbVar17[lVar12 + -1]]) {
        pbVar11 = pbVar18 + lVar12 + -2;
        goto LAB_001c3c6c;
      }
      lVar12 = lVar12 + 1;
    } while ((ulong)~uVar14 + 1 != lVar12);
  }
  psVar6 = (sqlite3_vtab *)(long)((pTab->p).pIndex)->nRead;
  goto LAB_001c3c85;
  while( true ) {
    uVar13 = ""[(byte)"fts5_source_id"[lVar12 + 0xc]];
    if (uVar13 != ""[pbVar17[lVar12 + -1]]) {
      pbVar18 = pbVar18 + lVar12 + -2;
      goto LAB_001c3cff;
    }
    lVar12 = lVar12 + 1;
    if ((ulong)(-uVar14 - (uint)(uVar14 != 0)) + 1 == lVar12) break;
LAB_001c3caf:
    if (lVar12 == 2) {
      uVar13 = '\0';
LAB_001c3cff:
      if (uVar13 != ""[*pbVar18]) {
        pcVar8 = sqlite3_mprintf("unknown special query: %.*s",-lVar9,pbVar17 + -1);
        goto LAB_001c3ac1;
      }
      break;
    }
  }
  psVar6 = pCursor[3].pVtab;
LAB_001c3c85:
  pCursor[0xb].pVtab = psVar6;
  iVar5 = 0;
LAB_001c396c:
  pConfig->pzErrmsg = ppcVar2;
  return iVar5;
}

Assistant:

static int fts5FilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *zUnused,            /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  Fts5FullTable *pTab = (Fts5FullTable*)(pCursor->pVtab);
  Fts5Config *pConfig = pTab->p.pConfig;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc = SQLITE_OK;             /* Error code */
  int iVal = 0;                   /* Counter for apVal[] */
  int bDesc;                      /* True if ORDER BY [rank|rowid] DESC */
  int bOrderByRank;               /* True if ORDER BY rank */
  sqlite3_value *pMatch = 0;      /* <tbl> MATCH ? expression (or NULL) */
  sqlite3_value *pRank = 0;       /* rank MATCH ? expression (or NULL) */
  sqlite3_value *pRowidEq = 0;    /* rowid = ? expression (or NULL) */
  sqlite3_value *pRowidLe = 0;    /* rowid <= ? expression (or NULL) */
  sqlite3_value *pRowidGe = 0;    /* rowid >= ? expression (or NULL) */
  int iCol;                       /* Column on LHS of MATCH operator */
  char **pzErrmsg = pConfig->pzErrmsg;

  UNUSED_PARAM(zUnused);
  UNUSED_PARAM(nVal);

  if( pCsr->ePlan ){
    fts5FreeCursorComponents(pCsr);
    memset(&pCsr->ePlan, 0, sizeof(Fts5Cursor) - ((u8*)&pCsr->ePlan-(u8*)pCsr));
  }

  assert( pCsr->pStmt==0 );
  assert( pCsr->pExpr==0 );
  assert( pCsr->csrflags==0 );
  assert( pCsr->pRank==0 );
  assert( pCsr->zRank==0 );
  assert( pCsr->zRankArgs==0 );

  assert( pzErrmsg==0 || pzErrmsg==&pTab->p.base.zErrMsg );
  pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Decode the arguments passed through to this function.
  **
  ** Note: The following set of if(...) statements must be in the same
  ** order as the corresponding entries in the struct at the top of
  ** fts5BestIndexMethod().  */
  if( BitFlagTest(idxNum, FTS5_BI_MATCH) ) pMatch = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_RANK) ) pRank = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_EQ) ) pRowidEq = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_LE) ) pRowidLe = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_GE) ) pRowidGe = apVal[iVal++];
  iCol = (idxNum>>16);
  assert( iCol>=0 && iCol<=pConfig->nCol );
  assert( iVal==nVal );
  bOrderByRank = ((idxNum & FTS5_BI_ORDER_RANK) ? 1 : 0);
  pCsr->bDesc = bDesc = ((idxNum & FTS5_BI_ORDER_DESC) ? 1 : 0);

  /* Set the cursor upper and lower rowid limits. Only some strategies 
  ** actually use them. This is ok, as the xBestIndex() method leaves the
  ** sqlite3_index_constraint.omit flag clear for range constraints
  ** on the rowid field.  */
  if( pRowidEq ){
    pRowidLe = pRowidGe = pRowidEq;
  }
  if( bDesc ){
    pCsr->iFirstRowid = fts5GetRowidLimit(pRowidLe, LARGEST_INT64);
    pCsr->iLastRowid = fts5GetRowidLimit(pRowidGe, SMALLEST_INT64);
  }else{
    pCsr->iLastRowid = fts5GetRowidLimit(pRowidLe, LARGEST_INT64);
    pCsr->iFirstRowid = fts5GetRowidLimit(pRowidGe, SMALLEST_INT64);
  }

  if( pTab->pSortCsr ){
    /* If pSortCsr is non-NULL, then this call is being made as part of 
    ** processing for a "... MATCH <expr> ORDER BY rank" query (ePlan is
    ** set to FTS5_PLAN_SORTED_MATCH). pSortCsr is the cursor that will
    ** return results to the user for this query. The current cursor 
    ** (pCursor) is used to execute the query issued by function 
    ** fts5CursorFirstSorted() above.  */
    assert( pRowidEq==0 && pRowidLe==0 && pRowidGe==0 && pRank==0 );
    assert( nVal==0 && pMatch==0 && bOrderByRank==0 && bDesc==0 );
    assert( pCsr->iLastRowid==LARGEST_INT64 );
    assert( pCsr->iFirstRowid==SMALLEST_INT64 );
    if( pTab->pSortCsr->bDesc ){
      pCsr->iLastRowid = pTab->pSortCsr->iFirstRowid;
      pCsr->iFirstRowid = pTab->pSortCsr->iLastRowid;
    }else{
      pCsr->iLastRowid = pTab->pSortCsr->iLastRowid;
      pCsr->iFirstRowid = pTab->pSortCsr->iFirstRowid;
    }
    pCsr->ePlan = FTS5_PLAN_SOURCE;
    pCsr->pExpr = pTab->pSortCsr->pExpr;
    rc = fts5CursorFirst(pTab, pCsr, bDesc);
  }else if( pMatch ){
    const char *zExpr = (const char*)sqlite3_value_text(apVal[0]);
    if( zExpr==0 ) zExpr = "";

    rc = fts5CursorParseRank(pConfig, pCsr, pRank);
    if( rc==SQLITE_OK ){
      if( zExpr[0]=='*' ){
        /* The user has issued a query of the form "MATCH '*...'". This
        ** indicates that the MATCH expression is not a full text query,
        ** but a request for an internal parameter.  */
        rc = fts5SpecialMatch(pTab, pCsr, &zExpr[1]);
      }else{
        char **pzErr = &pTab->p.base.zErrMsg;
        rc = sqlite3Fts5ExprNew(pConfig, iCol, zExpr, &pCsr->pExpr, pzErr);
        if( rc==SQLITE_OK ){
          if( bOrderByRank ){
            pCsr->ePlan = FTS5_PLAN_SORTED_MATCH;
            rc = fts5CursorFirstSorted(pTab, pCsr, bDesc);
          }else{
            pCsr->ePlan = FTS5_PLAN_MATCH;
            rc = fts5CursorFirst(pTab, pCsr, bDesc);
          }
        }
      }
    }
  }else if( pConfig->zContent==0 ){
    *pConfig->pzErrmsg = sqlite3_mprintf(
        "%s: table does not support scanning", pConfig->zName
    );
    rc = SQLITE_ERROR;
  }else{
    /* This is either a full-table scan (ePlan==FTS5_PLAN_SCAN) or a lookup
    ** by rowid (ePlan==FTS5_PLAN_ROWID).  */
    pCsr->ePlan = (pRowidEq ? FTS5_PLAN_ROWID : FTS5_PLAN_SCAN);
    rc = sqlite3Fts5StorageStmt(
        pTab->pStorage, fts5StmtType(pCsr), &pCsr->pStmt, &pTab->p.base.zErrMsg
    );
    if( rc==SQLITE_OK ){
      if( pCsr->ePlan==FTS5_PLAN_ROWID ){
        sqlite3_bind_value(pCsr->pStmt, 1, apVal[0]);
      }else{
        sqlite3_bind_int64(pCsr->pStmt, 1, pCsr->iFirstRowid);
        sqlite3_bind_int64(pCsr->pStmt, 2, pCsr->iLastRowid);
      }
      rc = fts5NextMethod(pCursor);
    }
  }

  pConfig->pzErrmsg = pzErrmsg;
  return rc;
}